

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O0

int GeneratedSaxParser::Utils::toInteger<int,true>
              (ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  bool bVar1;
  uint uVar2;
  undefined1 *in_RDX;
  ParserChar *in_RSI;
  undefined8 *in_RDI;
  bool digitFound;
  int sign;
  int value;
  ParserChar *s;
  int local_30;
  int local_2c;
  ParserChar *local_28;
  
  local_28 = (ParserChar *)*in_RDI;
  if (local_28 == (ParserChar *)0x0) {
    *in_RDX = 1;
  }
  else if (local_28 == in_RSI) {
    *in_RDX = 1;
    *in_RDI = in_RSI;
  }
  else {
    do {
      bVar1 = isWhiteSpace(*local_28);
      if (!bVar1) {
        local_2c = 0;
        local_30 = 1;
        if (*local_28 == '-') {
          local_28 = local_28 + 1;
          local_30 = -1;
        }
        else if (*local_28 == '+') {
          local_28 = local_28 + 1;
        }
        bVar1 = false;
        while( true ) {
          if (local_28 == in_RSI) {
            if (bVar1) {
              *in_RDX = 0;
              *in_RDI = local_28;
              return local_2c * local_30;
            }
            *in_RDX = 1;
            *in_RDI = local_28;
            return 0;
          }
          uVar2 = isdigit((int)*local_28);
          if ((uVar2 & 1) == 0) break;
          local_2c = local_2c * 10 + *local_28 + -0x30;
          bVar1 = true;
          local_28 = local_28 + 1;
        }
        if (bVar1) {
          *in_RDI = local_28;
          *in_RDX = 0;
          return local_2c * local_30;
        }
        *in_RDX = 1;
        *in_RDI = local_28;
        return 0;
      }
      local_28 = local_28 + 1;
    } while (local_28 != in_RSI);
    *in_RDX = 1;
    *in_RDI = in_RSI;
  }
  return 0;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar** buffer, const ParserChar* bufferEnd, bool& failed)
	{
		const ParserChar* s = *buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( s == bufferEnd )
		{
			failed = true;
			*buffer = bufferEnd;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( s == bufferEnd )
			{
				failed = true;
				*buffer = bufferEnd;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( s == bufferEnd )
			{
				if (digitFound)
				{
					failed = false;
					*buffer = s;
					if ( signedInteger )
						return value * sign;
					else
						return value;
				}
				else
				{
					failed = true;
					*buffer = s;
					return 0;
				}
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
				break;
			++s;
		}
		if ( digitFound )
		{
			*buffer = s;
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			*buffer = s;
			return 0;
		}
	}